

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

int CVmObjList::getp_get_unique(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  
  if (getp_get_unique(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_get_unique();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_unique::desc);
  pvVar4 = sp_;
  if (iVar5 == 0) {
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    vVar6 = create(0,lst);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    pvVar4 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar6 >> 0xc];
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    cons_uniquify((CVmObjList *)((long)&pCVar1->ptr_ + (ulong)((vVar6 & 0xfff) * 0x18)));
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_get_unique(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *argc)
{
    CVmObjList *new_lst_obj;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* put myself on the stack for GC protection */
    G_stk->push(self_val);

    /* 
     *   Make a copy of our list for the return value, since the result
     *   value will never be larger than the original list.  By making a
     *   copy of the input list, we also can avoid worrying about whether
     *   the input list was a constant, and hence we don't have to worry
     *   about the possibility of constant page swapping - we'll just
     *   update elements of the copy in-place.  
     */
    retval->set_obj(create(vmg_ FALSE, lst));

    /* get the return value list data */
    new_lst_obj = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* push a reference to the new list for gc protection */
    G_stk->push(retval);

    /* uniquify the list */
    new_lst_obj->cons_uniquify(vmg0_);

    /* discard the gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}